

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O1

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  QArrayData *pQVar1;
  QArrayData *pQVar2;
  XmlOutput *pXVar3;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  xml_output local_1b0;
  xml_output local_178;
  xml_output local_140;
  QArrayDataPointer<QString> local_108;
  QString local_f0;
  xml_output local_d8;
  xml_output local_a0;
  xml_output local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.xo_type = tTag;
  local_68.xo_text.d.d = *(Data **)((long)__buf + 0x40);
  local_68.xo_text.d.ptr = *(char16_t **)((long)__buf + 0x48);
  local_68.xo_text.d.size = *(qsizetype *)((long)__buf + 0x50);
  if (&(local_68.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68.xo_value.d.d = (Data *)0x0;
  local_68.xo_value.d.ptr = (char16_t *)0x0;
  local_68.xo_value.d.size = 0;
  pXVar3 = XmlOutput::operator<<((XmlOutput *)CONCAT44(in_register_00000034,__fd),&local_68);
  QVar4.m_data = (storage_type *)0x7;
  QVar4.m_size = (qsizetype)&local_a0;
  QString::fromUtf8(QVar4);
  local_a0.xo_text.d.size = (qsizetype)local_a0.xo_text.d.ptr;
  pQVar2 = (QArrayData *)CONCAT44(local_a0._4_4_,local_a0.xo_type);
  local_a0.xo_type = tTag;
  local_a0.xo_text.d.ptr = (char16_t *)local_a0.xo_text.d.d;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_a0.xo_value.d.d = (Data *)0x0;
  local_a0.xo_value.d.ptr = (char16_t *)0x0;
  local_a0.xo_value.d.size = 0;
  local_a0.xo_text.d.d = (Data *)pQVar2;
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_a0);
  local_108.d = *(Data **)((long)__buf + 8);
  local_108.ptr = *(QString **)((long)__buf + 0x10);
  local_108.size = *(qsizetype *)((long)__buf + 0x18);
  if (local_108.d != (Data *)0x0) {
    LOCK();
    ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  commandLinesForOutput(&local_f0,(QStringList *)&local_108);
  local_d8.xo_type = tValueTag;
  local_d8.xo_text.d.d = local_f0.d.d;
  local_d8.xo_text.d.ptr = local_f0.d.ptr;
  local_d8.xo_text.d.size = local_f0.d.size;
  if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_d8.xo_value.d.d = (Data *)0x0;
  local_d8.xo_value.d.ptr = (char16_t *)0x0;
  local_d8.xo_value.d.size = 0;
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_d8);
  QVar5.m_data = (storage_type *)0x7;
  QVar5.m_size = (qsizetype)&local_140;
  QString::fromUtf8(QVar5);
  local_140.xo_text.d.size = (qsizetype)local_140.xo_text.d.ptr;
  pQVar1 = (QArrayData *)CONCAT44(local_140._4_4_,local_140.xo_type);
  local_140.xo_type = tTag;
  local_140.xo_text.d.ptr = (char16_t *)local_140.xo_text.d.d;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_140.xo_value.d.d = (Data *)0x0;
  local_140.xo_value.d.ptr = (char16_t *)0x0;
  local_140.xo_value.d.size = 0;
  local_140.xo_text.d.d = (Data *)pQVar1;
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_140);
  local_178.xo_type = tValueTag;
  local_178.xo_text.d.d = *(Data **)((long)__buf + 0x20);
  local_178.xo_text.d.ptr = *(char16_t **)((long)__buf + 0x28);
  local_178.xo_text.d.size = *(qsizetype *)((long)__buf + 0x30);
  if (&(local_178.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_178.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_178.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
    ;
    UNLOCK();
  }
  local_178.xo_value.d.d = (Data *)0x0;
  local_178.xo_value.d.ptr = (char16_t *)0x0;
  local_178.xo_value.d.size = 0;
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_178);
  local_1b0.xo_type = tCloseTag;
  local_1b0.xo_text.d.d = *(Data **)((long)__buf + 0x40);
  local_1b0.xo_text.d.ptr = *(char16_t **)((long)__buf + 0x48);
  local_1b0.xo_text.d.size = *(qsizetype *)((long)__buf + 0x50);
  if (&(local_1b0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1b0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1b0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
    ;
    UNLOCK();
  }
  local_1b0.xo_value.d.d = (Data *)0x0;
  local_1b0.xo_value.d.ptr = (char16_t *)0x0;
  local_1b0.xo_value.d.size = 0;
  XmlOutput::operator<<(pXVar3,&local_1b0);
  if (&(local_1b0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1b0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1b0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1b0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1b0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1b0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1b0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1b0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1b0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_1b0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_178.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_178.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_178.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_178.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_178.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_178.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_178.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_178.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_178.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_178.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_140.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_140.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_140.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_140.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_140.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_140.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_140.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_140.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_140.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_140.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  if (&(local_d8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_d8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_d8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f0.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_108);
  if (&(local_a0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_a0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_a0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if (&(local_68.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_68.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_68.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, const VCEventTool &tool)
{
    xml
        << tag(tool.EventName)
            << tag(_Command) << valueTag(commandLinesForOutput(tool.CommandLine))
            << tag(_Message) << valueTag(tool.Description)
        << closetag(tool.EventName);
}